

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextVkImpl::EndQuery(DeviceContextVkImpl *this,IQuery *pQuery)

{
  QUERY_TYPE QVar1;
  VkQueryPool queryPool;
  Uint32 query;
  uint uVar2;
  QueryVkImpl *this_00;
  uint queryFlag;
  string msg;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::EndQuery
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pQuery,0);
  if (this->m_pQueryMgr == (QueryManagerVk *)0x0) {
    if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == false) {
      FormatString<char[80]>
                (&msg,(char (*) [80])
                      "Query manager should never be null for immediate contexts. This might be a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xb77);
      std::__cxx11::string::~string((string *)&msg);
      if (this->m_pQueryMgr != (QueryManagerVk *)0x0) goto LAB_001bb8a2;
    }
    FormatString<char[94]>
              (&msg,(char (*) [94])
                    "Query manager is null, which indicates that this deferred context is not in a recording state"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb78);
    std::__cxx11::string::~string((string *)&msg);
  }
LAB_001bb8a2:
  this_00 = ClassPtrCast<Diligent::QueryVkImpl,Diligent::IQuery>(pQuery);
  QVar1 = (this_00->super_QueryBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
          .m_Desc.Type;
  queryPool = (this->m_pQueryMgr->m_Pools)._M_elems[QVar1].m_vkQueryPool.m_VkObject;
  query = QueryVkImpl::GetQueryPoolIndex(this_00,(uint)((ulong)QVar1 == 5));
  if (queryPool == (VkQueryPool)0x0) {
    FormatString<char[45]>(&msg,(char (*) [45])"Query pool is not initialized for query type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb7f);
    std::__cxx11::string::~string((string *)&msg);
  }
  EnsureVkCmdBuffer(this);
  if ((QVar1 == QUERY_TYPE_DURATION) || (QVar1 == QUERY_TYPE_TIMESTAMP)) {
    VulkanUtilities::VulkanCommandBuffer::WriteTimestamp
              (&this->m_CommandBuffer,VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT,queryPool,query);
  }
  else {
    if (this->m_ActiveQueriesCounter < 1) {
      FormatString<char[99]>
                (&msg,(char (*) [99])
                      "Active query counter is 0 which means there was a mismatch between BeginQuery() / EndQuery() calls"
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xb88);
      std::__cxx11::string::~string((string *)&msg);
    }
    uVar2 = (this->m_CommandBuffer).m_State.OutsidePassQueries;
    queryFlag = 1 << ((byte)QVar1 & 0x1f);
    if ((((this->m_CommandBuffer).m_State.InsidePassQueries | uVar2) >> (QVar1 & 0x1f) & 1) == 0) {
      FormatString<char[124]>
                (&msg,(char (*) [124])
                      "No query flag is set which indicates there was no matching BeginQuery call or there was an error while beginning the query."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xb8e);
      std::__cxx11::string::~string((string *)&msg);
      uVar2 = (this->m_CommandBuffer).m_State.OutsidePassQueries;
    }
    if ((uVar2 & queryFlag) == 0) {
      if ((this->m_CommandBuffer).m_State.RenderPass == (VkRenderPass)0x0) {
        FormatString<char[297]>
                  (&msg,(char (*) [297])
                        "The query was started inside render pass, but is being ended outside of render pass. Vulkan requires that a query must either begin and end inside the same subpass of a render pass instance, or must both begin and end outside of a render pass instance (i.e. contain entire render pass instances)."
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    else {
      EndRenderScope(this);
    }
    this->m_ActiveQueriesCounter = this->m_ActiveQueriesCounter + -1;
    VulkanUtilities::VulkanCommandBuffer::EndQuery(&this->m_CommandBuffer,queryPool,query,queryFlag)
    ;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::EndQuery(IQuery* pQuery)
{
    TDeviceContextBase::EndQuery(pQuery, 0);

    VERIFY(m_pQueryMgr != nullptr || IsDeferred(), "Query manager should never be null for immediate contexts. This might be a bug.");
    DEV_CHECK_ERR(m_pQueryMgr != nullptr, "Query manager is null, which indicates that this deferred context is not in a recording state");

    QueryVkImpl*     pQueryVkImpl = ClassPtrCast<QueryVkImpl>(pQuery);
    const QUERY_TYPE QueryType    = pQueryVkImpl->GetDesc().Type;
    VkQueryPool      vkQueryPool  = m_pQueryMgr->GetQueryPool(QueryType);
    Uint32           Idx          = pQueryVkImpl->GetQueryPoolIndex(QueryType == QUERY_TYPE_DURATION ? 1 : 0);

    VERIFY(vkQueryPool != VK_NULL_HANDLE, "Query pool is not initialized for query type");

    EnsureVkCmdBuffer();
    if (QueryType == QUERY_TYPE_TIMESTAMP || QueryType == QUERY_TYPE_DURATION)
    {
        m_CommandBuffer.WriteTimestamp(VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, vkQueryPool, Idx);
    }
    else
    {
        VERIFY(m_ActiveQueriesCounter > 0, "Active query counter is 0 which means there was a mismatch between BeginQuery() / EndQuery() calls");

        // A query must either begin and end inside the same subpass of a render pass instance, or must
        // both begin and end outside of a render pass instance (i.e. contain entire render pass instances).
        const VulkanUtilities::VulkanCommandBuffer::StateCache& CmdBuffState = m_CommandBuffer.GetState();
        VERIFY((CmdBuffState.InsidePassQueries | CmdBuffState.OutsidePassQueries) & (1u << QueryType),
               "No query flag is set which indicates there was no matching BeginQuery call or there was an error while beginning the query.");
        if (CmdBuffState.OutsidePassQueries & (1 << QueryType))
        {
            EndRenderScope();
        }
        else
        {
            if (!m_CommandBuffer.GetState().RenderPass)
                LOG_ERROR_MESSAGE("The query was started inside render pass, but is being ended outside of render pass. "
                                  "Vulkan requires that a query must either begin and end inside the same "
                                  "subpass of a render pass instance, or must both begin and end outside of a render pass "
                                  "instance (i.e. contain entire render pass instances).");
        }

        --m_ActiveQueriesCounter;
        m_CommandBuffer.EndQuery(vkQueryPool, Idx, 1u << QueryType);
    }
}